

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffmnhd(fitsfile *fptr,int exttype,char *hduname,int hduver,int *status)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int tstatus;
  int exact;
  undefined8 local_a0;
  int local_98;
  int local_94;
  int match;
  int hdutype;
  char *local_88;
  long extver;
  char extname [71];
  
  if (0 < *status) {
    return *status;
  }
  iVar5 = 0;
  iVar4 = fptr->HDUposition;
  local_98 = hduver;
  local_88 = hduname;
  if (fptr->Fptr->only_one == 0) {
    bVar6 = true;
  }
  else {
    sVar2 = strlen(hduname);
    bVar6 = hduname[(long)((sVar2 << 0x20) + -0x100000000) >> 0x20] == '#';
  }
  local_94 = iVar4 + 1;
  local_a0 = 0;
  iVar4 = 1;
  do {
    tstatus = 0;
    iVar1 = ffmahd(fptr,iVar4,&hdutype,&tstatus);
    if (iVar1 != 0) {
      ffmahd(fptr,local_94,(int *)0x0,status);
      *status = 0x12d;
      return 0x12d;
    }
    iVar1 = fits_is_compressed_image(fptr,status);
    if (((exttype == -1) || (hdutype == exttype)) || (hdutype == (-(uint)(iVar1 == 0) | 2))) {
      ffmaky(fptr,2,status);
      iVar1 = ffgkys(fptr,"EXTNAME",extname,(char *)0x0,&tstatus);
      if (iVar1 < 1) {
        if (!bVar6) {
          sVar2 = strlen(extname);
          lVar3 = (long)((sVar2 << 0x20) + -0x100000000) >> 0x20;
          local_a0 = 0;
          if (extname[lVar3] == '#') {
            extname[lVar3] = '\0';
            local_a0 = 1;
          }
        }
        ffcmps(local_88,extname,0,&match,&exact);
        iVar5 = exact;
      }
      if ((tstatus != 0) || (iVar5 == 0)) {
        tstatus = 0;
        iVar1 = ffgkys(fptr,"HDUNAME",extname,(char *)0x0,&tstatus);
        if (iVar1 < 1) {
          if (!bVar6) {
            sVar2 = strlen(extname);
            lVar3 = (long)((sVar2 << 0x20) + -0x100000000) >> 0x20;
            local_a0 = 0;
            if (extname[lVar3] == '#') {
              extname[lVar3] = '\0';
              local_a0 = 1;
            }
          }
          ffcmps(local_88,extname,0,&match,&exact);
          iVar5 = exact;
        }
      }
      if ((tstatus == 0) && (iVar5 != 0)) {
        if (local_98 == 0) {
LAB_001379fe:
          if ((int)local_a0 != 0) {
            fptr->Fptr->only_one = 0;
          }
          return *status;
        }
        iVar1 = ffgkyj(fptr,"EXTVER",&extver,(char *)0x0,&tstatus);
        if (iVar1 < 1) {
        }
        else {
          extver = 1;
          extver._0_4_ = 1;
        }
        if ((int)extver == local_98) goto LAB_001379fe;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int ffmnhd(fitsfile *fptr,      /* I - FITS file pointer                    */
           int exttype,         /* I - desired extension type               */
           char *hduname,       /* I - desired EXTNAME value for the HDU    */
           int hduver,          /* I - desired EXTVERS value for the HDU    */
           int *status)         /* IO - error status                        */
/*
  Move to the next HDU with a given extension type (IMAGE_HDU, ASCII_TBL,
  BINARY_TBL, or ANY_HDU), extension name (EXTNAME or HDUNAME keyword),
  and EXTVERS keyword values.  If hduvers = 0, then move to the first HDU
  with the given type and name regardless of EXTVERS value.  If no matching
  HDU is found in the file, then the current open HDU will remain unchanged.
*/
{
    char extname[FLEN_VALUE];
    int ii, hdutype, alttype, extnum, tstatus, match, exact;
    int slen, putback = 0, chopped = 0;
    long extver;

    if (*status > 0)
        return(*status);

    extnum = fptr->HDUposition + 1;  /* save the current HDU number */

    /*
       This is a kludge to deal with a special case where the
       user specified a hduname that ended with a # character, which
       CFITSIO previously interpreted as a flag to mean "don't copy any
       other HDUs in the file into the virtual file in memory.  If the
       remaining hduname does not end with a # character (meaning that
       the user originally entered a hduname ending in 2 # characters)
       then there is the possibility that the # character should be
       treated literally, if the actual EXTNAME also ends with a #.
       Setting putback = 1 means that we need to test for this case later on.
    */
        
    if ((fptr->Fptr)->only_one) {  /* if true, name orignally ended with a # */
       slen = strlen(hduname);
       if (hduname[slen - 1] != '#') /* This will fail if real EXTNAME value */
           putback = 1;              /*  ends with 2 # characters. */
    } 

    for (ii=1; 1; ii++)    /* loop over all HDUs until EOF */
    {
        tstatus = 0;
        if (ffmahd(fptr, ii, &hdutype, &tstatus))  /* move to next HDU */
        {
           ffmahd(fptr, extnum, 0, status); /* restore original file position */
           return(*status = BAD_HDU_NUM);   /* couldn't find desired HDU */
        }

        alttype = -1; 
        if (fits_is_compressed_image(fptr, status))
            alttype = BINARY_TBL;
        
        /* Does this HDU have a matching type? */
        if (exttype == ANY_HDU || hdutype == exttype || hdutype == alttype)
        {
          ffmaky(fptr, 2, status); /* reset to the 2nd keyword in the header */
          if (ffgkys(fptr, "EXTNAME", extname, 0, &tstatus) <= 0) /* get keyword */
          {
               if (putback) {          /* more of the kludge */
                   /* test if the EXTNAME value ends with a #;  if so, chop it  */
		   /* off before comparing the strings */
		   chopped = 0;
	           slen = strlen(extname);
		   if (extname[slen - 1] == '#') {
		       extname[slen - 1] = '\0'; 
                       chopped = 1;
                   }
               }

               /* see if the strings are an exact match */
               ffcmps(hduname, extname, CASEINSEN, &match, &exact);
          }

          /* if EXTNAME keyword doesn't exist, or it does not match, then try HDUNAME */
          if (tstatus || !exact)
	  {
               tstatus = 0;
               if (ffgkys(fptr, "HDUNAME", extname, 0, &tstatus) <= 0)
	       {
                   if (putback) {          /* more of the kludge */
		       chopped = 0;
	               slen = strlen(extname);
		       if (extname[slen - 1] == '#') {
		           extname[slen - 1] = '\0';  /* chop off the # */
                           chopped = 1;
                       }
                   }

                   /* see if the strings are an exact match */
                   ffcmps(hduname, extname, CASEINSEN, &match, &exact);
               }
          }

          if (!tstatus && exact)    /* found a matching name */
          {
             if (hduver)  /* need to check if version numbers match? */
             {
                if (ffgkyj(fptr, "EXTVER", &extver, 0, &tstatus) > 0)
                    extver = 1;  /* assume default EXTVER value */

                if ( (int) extver == hduver)
                {
                    if (chopped) {
                        /* The # was literally part of the name, not a flag */
	                (fptr->Fptr)->only_one = 0;  
                    }
                    return(*status);    /* found matching name and vers */
                }
             }
             else
             {
                 if (chopped) {
                     /* The # was literally part of the name, not a flag */
	            (fptr->Fptr)->only_one = 0;  
                 }
                 return(*status);    /* found matching name */
             }
          }  /* end of !tstatus && exact */

        }  /* end of matching HDU type */
    }  /* end of loop over HDUs */
}